

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

int32 Js::JavascriptNativeIntArray::Pop(ScriptContext *scriptContext,Var object)

{
  bool bVar1;
  ThreadContext *pTVar2;
  code *pcVar3;
  bool bVar4;
  int32 iVar5;
  undefined4 *puVar6;
  JavascriptArray *this;
  uint32 index;
  
  pTVar2 = scriptContext->threadContext;
  bVar1 = pTVar2->noJsReentrancy;
  pTVar2->noJsReentrancy = true;
  bVar4 = VarIs<Js::JavascriptNativeIntArray>(object);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x138b,"(VarIs<JavascriptNativeIntArray>(object))",
                                "VarIs<JavascriptNativeIntArray>(object)");
    if (!bVar4) goto LAB_00b85975;
    *puVar6 = 0;
  }
  this = (JavascriptArray *)VarTo<Js::JavascriptNativeIntArray>(object);
  if ((this->super_ArrayObject).length == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x138e,"(arr->GetLength() != 0)","arr->GetLength() != 0");
    if (!bVar4) {
LAB_00b85975:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  index = (this->super_ArrayObject).length - 1;
  iVar5 = JavascriptOperators::OP_GetNativeIntElementI_UInt32(object,index,scriptContext);
  if (iVar5 != -0x7fffe) {
    JavascriptArray::SetLength(this,index);
  }
  pTVar2->noJsReentrancy = bVar1;
  return iVar5;
}

Assistant:

int32 JavascriptNativeIntArray::Pop(ScriptContext * scriptContext, Var object)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(Array_NativeIntPop, reentrancylock, scriptContext->GetThreadContext());
        Assert(VarIs<JavascriptNativeIntArray>(object));
        JavascriptNativeIntArray * arr = VarTo<JavascriptNativeIntArray>(object);

        Assert(arr->GetLength() != 0);

        uint32 index = arr->length - 1;

        int32 element = Js::JavascriptOperators::OP_GetNativeIntElementI_UInt32(object, index, scriptContext);

        //If it is a missing item, then don't update the length - Pre-op Bail out will happen.
        if(!SparseArraySegment<int32>::IsMissingItem(&element))
        {
            arr->SetLength(index);
        }
        
        return element;
        JIT_HELPER_END(Array_NativeIntPop);
    }